

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O2

Point3<float>
pbrt::BlossomCubicBezier<pbrt::Point3<float>>
          (span<const_pbrt::Point3<float>_> p,Float u0,Float u1,Float u2)

{
  Tuple3<pbrt::Point3,_float> *t0;
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [56];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Point3<float> PVar7;
  Tuple3<pbrt::Point3,_float> TVar8;
  Tuple3<pbrt::Point3,_float> local_68;
  Tuple3<pbrt::Point3,_float> local_5c;
  Tuple3<pbrt::Point3,_float> local_48;
  Tuple3<pbrt::Point3,_float> local_3c;
  Tuple3<pbrt::Point3,_float> local_30;
  
  auVar6 = in_register_00001204._4_56_;
  t0 = &(p.ptr)->super_Tuple3<pbrt::Point3,_float>;
  PVar7 = Lerp<pbrt::Point3,float>(u0,t0,t0 + 1);
  local_48.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar1._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_56_ = auVar6;
  local_48._0_8_ = vmovlps_avx(auVar1._0_16_);
  auVar6 = (undefined1  [56])0x0;
  PVar7 = Lerp<pbrt::Point3,float>(u0,t0 + 1,t0 + 2);
  local_3c.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar2._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar6;
  local_3c._0_8_ = vmovlps_avx(auVar2._0_16_);
  auVar6 = (undefined1  [56])0x0;
  PVar7 = Lerp<pbrt::Point3,float>(u0,t0 + 2,t0 + 3);
  local_30.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar6;
  local_30._0_8_ = vmovlps_avx(auVar3._0_16_);
  auVar6 = (undefined1  [56])0x0;
  PVar7 = Lerp<pbrt::Point3,float>(u1,&local_48,&local_3c);
  local_68.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  local_68._0_8_ = vmovlps_avx(auVar4._0_16_);
  auVar6 = (undefined1  [56])0x0;
  PVar7 = Lerp<pbrt::Point3,float>(u1,&local_3c,&local_30);
  local_5c.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  local_5c._0_8_ = vmovlps_avx(auVar5._0_16_);
  TVar8 = (Tuple3<pbrt::Point3,_float>)Lerp<pbrt::Point3,float>(u2,&local_68,&local_5c);
  return (Point3<float>)TVar8;
}

Assistant:

PBRT_CPU_GPU inline P BlossomCubicBezier(pstd::span<const P> p, Float u0, Float u1,
                                         Float u2) {
    P a[3] = {Lerp(u0, p[0], p[1]), Lerp(u0, p[1], p[2]), Lerp(u0, p[2], p[3])};
    P b[2] = {Lerp(u1, a[0], a[1]), Lerp(u1, a[1], a[2])};
    return Lerp(u2, b[0], b[1]);
}